

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall PRED<RemSP>::PerformLabelingWithSteps(PRED<RemSP> *this)

{
  PerformanceEvaluator *this_00;
  string local_40;
  double local_20;
  
  local_20 = Alloc(this);
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(this_00);
  FirstScan(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&local_40,FIRST_SCAN);
  PerformanceEvaluator::store
            (this_00,&local_40,
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&local_40);
  PerformanceEvaluator::start(this_00);
  SecondScan(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&local_40,SECOND_SCAN);
  PerformanceEvaluator::store
            (this_00,&local_40,
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&local_40);
  PerformanceEvaluator::start(this_00);
  RemSP::Dealloc();
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&local_40,ALLOC_DEALLOC);
  PerformanceEvaluator::store
            (this_00,&local_40,
             local_20 +
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PerformLabelingWithSteps()
    {
        double alloc_timing = Alloc();

        perf_.start();
        FirstScan();
        perf_.stop();
        perf_.store(Step(StepType::FIRST_SCAN), perf_.last());

        perf_.start();
        SecondScan();
        perf_.stop();
        perf_.store(Step(StepType::SECOND_SCAN), perf_.last());

        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing);

    }